

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

char * CVmObjFileName::url_to_local(char *str,size_t len,int nullterm)

{
  void *pvVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  char *buf;
  char *result_buf;
  long *plVar5;
  size_t len_00;
  err_frame_t err_cur__;
  uint local_108 [2];
  undefined8 local_100;
  void *local_f8;
  __jmp_buf_tag local_f0;
  
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  local_100 = *puVar3;
  uVar4 = _ZTW11G_err_frame();
  *(uint **)uVar4 = local_108;
  local_108[0] = _setjmp(&local_f0);
  if (local_108[0] == 0) {
    len_00 = 0x1000;
    if (0x1000 < len + 0x20) {
      len_00 = len + 0x20;
    }
    if (nullterm == 0) {
      buf = lib_copy_str(str,len);
      str = buf;
    }
    else {
      buf = (char *)0x0;
    }
    result_buf = lib_alloc_str(len_00);
    iVar2 = CVmNetFile::is_net_mode();
    if (iVar2 == 0) {
      os_cvt_url_dir(result_buf,len_00,str);
    }
    else {
      lib_strcpy(result_buf,len_00,str);
    }
  }
  else {
    result_buf = (char *)0x0;
    buf = result_buf;
  }
  if (local_108[0] == 1) {
    local_108[0] = 2;
    lib_free_str(result_buf);
    err_rethrow();
  }
  if (-1 < (short)local_108[0]) {
    local_108[0] = local_108[0] | 0x8000;
    lib_free_str(buf);
  }
  uVar4 = local_100;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = uVar4;
  if ((local_108[0] & 0x4001) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar3 & 2) != 0) {
      plVar5 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar5 + 0x10));
    }
    pvVar1 = local_f8;
    plVar5 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar5 + 0x10) = pvVar1;
    err_rethrow();
  }
  if ((local_108[0] & 2) != 0) {
    free(local_f8);
  }
  return result_buf;
}

Assistant:

char *CVmObjFileName::url_to_local(
    VMG_ const char *str, size_t len, int nullterm)
{
    char *strz = 0, *buf = 0;
    err_try
    {
        /* 
         *   Estimate the length of the return string we'll need.  Most
         *   systems these days have Unix-like file naming, where the result
         *   path will be the same length as the source path.  There are
         *   older systems with more complex conventions; for example, VMS
         *   puts directories in brackets.  To allow for this kind of
         *   variation, allocate space for the combined string plus some
         *   overhead.  In any case, use the local maximum filename length as
         *   the lower limit.
         */
        size_t buflen = len + 32;
        if (buflen < OSFNMAX)
            buflen = OSFNMAX;
        
        /* make a null-terminated copy of the string if necessary */
        if (!nullterm)
            strz = lib_copy_str(str, len);
        
        /* allocate a conversion buffer */
        buf = lib_alloc_str(buflen);
        
        /* convert the name */
        fn_cvt_url_dir(vmg_ buf, buflen, nullterm ? str : strz);
    }